

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

void __thiscall
cmComputeTargetDepends::AddObjectDepends
          (cmComputeTargetDepends *this,size_t depender_index,cmSourceFile *o,
          set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *emitted)

{
  cmGeneratorTarget *this_00;
  TargetType TVar1;
  ulong uVar2;
  reference ppcVar3;
  cmake *this_01;
  pair<std::_Rb_tree_const_iterator<cmLinkItem>,_bool> pVar4;
  undefined1 local_1a0 [24];
  string local_188;
  undefined8 local_168;
  undefined1 local_160 [16];
  undefined1 local_150;
  cmListFileBacktrace local_148 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_100;
  cmLinkItem local_d0;
  value_type *local_68;
  cmLinkItem *objItem;
  cmGeneratorTarget *depender;
  _Rb_tree_node_base local_50;
  _Rb_tree_node_base *local_30;
  string *objLib;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *emitted_local;
  cmSourceFile *o_local;
  size_t depender_index_local;
  cmComputeTargetDepends *this_local;
  
  objLib = (string *)emitted;
  emitted_local = (set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)o;
  o_local = (cmSourceFile *)depender_index;
  depender_index_local = (size_t)this;
  cmSourceFile::GetObjectLibrary_abi_cxx11_((string *)&local_50,o);
  local_30 = &local_50;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    depender._4_4_ = 1;
    goto LAB_009c5d27;
  }
  ppcVar3 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
            operator[](&this->Targets,(size_type)o_local);
  this_00 = *ppcVar3;
  objItem = (cmLinkItem *)this_00;
  std::__cxx11::string::string((string *)&local_120,(string *)local_30);
  local_148[0].super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_148[0].super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmListFileBacktrace::cmListFileBacktrace(local_148);
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
            (&local_100,&local_120,local_148);
  cmGeneratorTarget::ResolveLinkItem(&local_d0,this_00,&local_100,&cmLinkItem::DEFAULT_abi_cxx11_);
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
            (&local_100);
  cmListFileBacktrace::~cmListFileBacktrace(local_148);
  std::__cxx11::string::~string((string *)&local_120);
  local_68 = &local_d0;
  pVar4 = std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::insert
                    ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)objLib,
                     local_68);
  local_168 = pVar4.first._M_node;
  local_160[0] = pVar4.second;
  local_160._8_8_ = local_168;
  local_150 = local_160[0];
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
LAB_009c5d14:
    depender._4_4_ = 0;
  }
  else {
    TVar1 = cmGeneratorTarget::GetType((cmGeneratorTarget *)objItem);
    if (TVar1 == EXECUTABLE) {
LAB_009c5cfc:
      cmTarget::AddUtility
                (*(cmTarget **)&objItem->String,(string *)local_30,false,(cmMakefile *)0x0);
      goto LAB_009c5d14;
    }
    TVar1 = cmGeneratorTarget::GetType((cmGeneratorTarget *)objItem);
    if (TVar1 == STATIC_LIBRARY) goto LAB_009c5cfc;
    TVar1 = cmGeneratorTarget::GetType((cmGeneratorTarget *)objItem);
    if (TVar1 == SHARED_LIBRARY) goto LAB_009c5cfc;
    TVar1 = cmGeneratorTarget::GetType((cmGeneratorTarget *)objItem);
    if (TVar1 == MODULE_LIBRARY) goto LAB_009c5cfc;
    TVar1 = cmGeneratorTarget::GetType((cmGeneratorTarget *)objItem);
    if (TVar1 == OBJECT_LIBRARY) goto LAB_009c5cfc;
    this_01 = cmGlobalGenerator::GetCMakeInstance(this->GlobalGenerator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_188,"Only executables and libraries may reference target objects.",
               (allocator<char> *)(local_1a0 + 0x17));
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_1a0);
    cmake::IssueMessage(this_01,FATAL_ERROR,&local_188,(cmListFileBacktrace *)local_1a0);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_1a0);
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator((allocator<char> *)(local_1a0 + 0x17));
    depender._4_4_ = 1;
  }
  cmLinkItem::~cmLinkItem(&local_d0);
LAB_009c5d27:
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void cmComputeTargetDepends::AddObjectDepends(size_t depender_index,
                                              cmSourceFile const* o,
                                              std::set<cmLinkItem>& emitted)
{
  std::string const& objLib = o->GetObjectLibrary();
  if (objLib.empty()) {
    return;
  }
  cmGeneratorTarget const* depender = this->Targets[depender_index];
  cmLinkItem const& objItem =
    depender->ResolveLinkItem(BT<std::string>(objLib));
  if (emitted.insert(objItem).second) {
    if (depender->GetType() != cmStateEnums::EXECUTABLE &&
        depender->GetType() != cmStateEnums::STATIC_LIBRARY &&
        depender->GetType() != cmStateEnums::SHARED_LIBRARY &&
        depender->GetType() != cmStateEnums::MODULE_LIBRARY &&
        depender->GetType() != cmStateEnums::OBJECT_LIBRARY) {
      this->GlobalGenerator->GetCMakeInstance()->IssueMessage(
        MessageType::FATAL_ERROR,
        "Only executables and libraries may reference target objects.",
        depender->GetBacktrace());
      return;
    }
    const_cast<cmGeneratorTarget*>(depender)->Target->AddUtility(objLib,
                                                                 false);
  }
}